

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fDepthRangeTests.cpp
# Opt level: O3

IterateResult __thiscall
deqp::gles2::Functional::DepthRangeCompareCase::iterate(DepthRangeCompareCase *this)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  RenderContext *pRVar5;
  bool bVar6;
  deUint32 dVar7;
  int iVar8;
  GLint location;
  GLuint index;
  GLenum GVar9;
  undefined4 extraout_var;
  NotSupportedError *this_00;
  TestError *this_01;
  uint x;
  uint y;
  char *description;
  undefined4 uVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  long lVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  Surface referenceFrame;
  Surface renderedFrame;
  ProgramSources sources;
  Random rnd;
  ShaderProgram program;
  Surface local_310;
  TestLog *local_2f8;
  value_type local_2f0;
  Surface local_2d0;
  value_type local_2b8;
  undefined1 local_298 [8];
  float local_290;
  undefined8 local_28c;
  int local_284;
  float local_280 [5];
  undefined8 local_26c;
  undefined4 local_264;
  float local_260;
  undefined4 local_25c;
  ios_base local_220 [24];
  vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_> local_208;
  undefined1 local_1e8 [216];
  deRandom local_110;
  ShaderProgram local_100;
  int *piVar10;
  
  local_2f8 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  dVar7 = deStringHash((this->super_TestCase).super_TestCase.super_TestNode.m_name._M_dataplus._M_p)
  ;
  deRandom_init(&local_110,dVar7);
  iVar8 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[4])();
  piVar10 = (int *)CONCAT44(extraout_var,iVar8);
  iVar8 = *piVar10;
  iVar14 = 0x80;
  if (iVar8 < 0x80) {
    iVar14 = iVar8;
  }
  iVar13 = 0x80;
  if (piVar10[1] < 0x80) {
    iVar13 = piVar10[1];
  }
  dVar7 = deRandom_getUint32(&local_110);
  x = dVar7 % ((iVar8 - iVar14) + 1U);
  iVar8 = piVar10[1];
  dVar7 = deRandom_getUint32(&local_110);
  y = dVar7 % ((iVar8 - iVar13) + 1U);
  tcu::Surface::Surface(&local_2d0,iVar14,iVar13);
  tcu::Surface::Surface(&local_310,iVar14,iVar13);
  if (piVar10[6] == 0) {
    this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (this_00,"Depth buffer is required",glcts::fixed_sample_locations_values + 1,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fDepthRangeTests.cpp"
               ,0x9a);
    __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  pRVar5 = ((this->super_TestCase).m_context)->m_renderCtx;
  local_2f0._M_dataplus._M_p = (pointer)&local_2f0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_2f0,
             "attribute highp vec4 a_position;\nattribute highp vec2 a_coord;\nvoid main (void)\n{\n\tgl_Position = a_position;\n}\n"
             ,"");
  local_2b8._M_dataplus._M_p = (pointer)&local_2b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_2b8,
             "uniform mediump vec4 u_color;\nvoid main (void)\n{\n\tgl_FragColor = u_color;\n}\n",""
            );
  memset((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)local_298,0,0xac);
  local_1e8._0_8_ = (pointer)0x0;
  local_1e8[8] = 0;
  local_1e8._9_7_ = 0;
  local_1e8[0x10] = 0;
  local_1e8._17_8_ = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_298,&local_2f0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_280,&local_2b8);
  glu::ShaderProgram::ShaderProgram(&local_100,pRVar5,(ProgramSources *)local_298);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_1e8);
  std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
            (&local_208);
  lVar15 = 0x78;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_298 + lVar15));
    lVar15 = lVar15 + -0x18;
  } while (lVar15 != -0x18);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
    operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
    operator_delete(local_2f0._M_dataplus._M_p,local_2f0.field_2._M_allocated_capacity + 1);
  }
  if (local_100.m_program.m_info.linkOk == false) {
    glu::operator<<(local_2f8,&local_100);
    this_01 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_01,"Compile failed",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fDepthRangeTests.cpp"
               ,0xa1);
    __cxa_throw(this_01,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  location = glwGetUniformLocation(local_100.m_program.m_program,"u_color");
  index = glwGetAttribLocation(local_100.m_program.m_program,"a_position");
  local_298 = (undefined1  [8])
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_290);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_290,"glDepthRangef(",0xe);
  std::ostream::_M_insert<double>((double)this->m_zNear);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_290,", ",2);
  std::ostream::_M_insert<double>((double)this->m_zFar);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_290,")",1);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_298,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_290);
  std::ios_base::~ios_base(local_220);
  glwViewport(x,y,iVar14,iVar13);
  glwClear(0x4500);
  glwEnable(0xb71);
  glwUseProgram(local_100.m_program.m_program);
  glwEnableVertexAttribArray(index);
  glwUniform4f(location,0.0,0.0,1.0,1.0);
  glwDepthFunc(0x207);
  glwVertexAttribPointer(index,4,0x1406,'\0',0,iterate::constDepthCoord);
  glwDrawElements(4,6,0x1403,iterate::quadIndices);
  glwVertexAttribPointer(index,4,0x1406,'\0',0,iterate::varyingDepthCoord);
  glwDrawElements(4,6,0x1403,iterate::quadIndices);
  GVar9 = glwGetError();
  glu::checkError(GVar9,(char *)0x0,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fDepthRangeTests.cpp"
                  ,0xcb);
  local_298._0_4_ = 0xbf800000;
  local_298._4_4_ = 0xbf800000;
  local_290 = (this->m_depthCoord).m_data[0];
  local_28c = 0xbf8000003f800000;
  local_284 = 0x3f800000;
  local_280[0] = (this->m_depthCoord).m_data[1];
  local_280._4_8_ = 0x3f8000003f800000;
  local_280[3] = -1.0;
  local_280[4] = (this->m_depthCoord).m_data[2];
  local_26c = 0x3f8000003f800000;
  local_264 = 0x3f800000;
  local_260 = (this->m_depthCoord).m_data[3];
  local_25c = 0x3f800000;
  glwDepthRangef(this->m_zNear,this->m_zFar);
  glwDepthFunc(this->m_compareFunc);
  glwUniform4f(location,0.0,1.0,0.0,1.0);
  glwVertexAttribPointer(index,4,0x1406,'\0',0,local_298);
  glwDrawElements(4,6,0x1403,iterate::quadIndices);
  GVar9 = glwGetError();
  glu::checkError(GVar9,(char *)0x0,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fDepthRangeTests.cpp"
                  ,0xdf);
  pRVar5 = ((this->super_TestCase).m_context)->m_renderCtx;
  local_2f0._M_dataplus._M_p = (pointer)0x300000008;
  if ((void *)local_2d0.m_pixels.m_cap != (void *)0x0) {
    local_2d0.m_pixels.m_cap = (size_t)local_2d0.m_pixels.m_ptr;
  }
  tcu::PixelBufferAccess::PixelBufferAccess
            ((PixelBufferAccess *)local_298,(TextureFormat *)&local_2f0,local_2d0.m_width,
             local_2d0.m_height,1,(void *)local_2d0.m_pixels.m_cap);
  glu::readPixels(pRVar5,x,y,(PixelBufferAccess *)local_298);
  if (0 < local_310.m_height) {
    fVar16 = this->m_zNear;
    fVar17 = this->m_zFar;
    fVar18 = 1.0;
    if (fVar16 <= 1.0) {
      fVar18 = fVar16;
    }
    fVar18 = (float)(~-(uint)(fVar16 < 0.0) & (uint)fVar18);
    fVar16 = 1.0;
    if (fVar17 <= 1.0) {
      fVar16 = fVar17;
    }
    fVar16 = (float)(~-(uint)(fVar17 < 0.0) & (uint)fVar16);
    fVar17 = (fVar16 - fVar18) * 0.5;
    fVar16 = (fVar16 + fVar18) * 0.5;
    iVar8 = 0;
    do {
      fVar18 = ((float)iVar8 + 0.5) / (float)local_310.m_height;
      iVar13 = (int)((float)local_310.m_width * 0.5 + 0.5);
      iVar14 = local_310.m_width;
      if (iVar13 < local_310.m_width) {
        iVar14 = iVar13;
      }
      if (iVar13 < 0) {
        iVar14 = 0;
      }
      if (0 < iVar14) {
        fVar1 = (this->m_depthCoord).m_data[3];
        fVar2 = (this->m_depthCoord).m_data[2];
        fVar3 = (this->m_depthCoord).m_data[0];
        fVar4 = (this->m_depthCoord).m_data[1];
        iVar13 = 0;
        do {
          fVar19 = ((float)iVar13 + 0.5) / (float)local_310.m_width;
          if (1.0 <= fVar18 + fVar19) {
            fVar19 = (1.0 - fVar19) * (fVar4 - fVar1) + fVar1 + (fVar2 - fVar1) * (1.0 - fVar18);
          }
          else {
            fVar19 = fVar19 * (fVar2 - fVar3) + fVar3 + (fVar4 - fVar3) * fVar18;
          }
          if (this->m_compareFunc - 0x201 < 7) {
            fVar19 = fVar19 * fVar17 + fVar16;
            uVar11 = 0xff00ff00;
            switch(this->m_compareFunc) {
            case 0x201:
              if (0.55 <= fVar19) goto LAB_00f843a3;
              break;
            case 0x202:
              if ((fVar19 != 0.55) || (NAN(fVar19))) goto LAB_00f843a3;
              break;
            case 0x203:
              if (0.55 < fVar19) goto LAB_00f843a3;
              break;
            case 0x204:
              if (fVar19 <= 0.55) goto LAB_00f843a3;
              break;
            case 0x205:
              if ((fVar19 == 0.55) && (!NAN(fVar19))) goto LAB_00f843a3;
              break;
            case 0x206:
              if (fVar19 < 0.55) goto LAB_00f843a3;
            }
          }
          else {
LAB_00f843a3:
            uVar11 = 0xffff0000;
          }
          *(undefined4 *)
           ((long)local_310.m_pixels.m_ptr + (long)(local_310.m_width * iVar8 + iVar13) * 4) =
               uVar11;
          iVar13 = iVar13 + 1;
        } while (iVar14 != iVar13);
      }
      if (iVar14 < local_310.m_width) {
        fVar1 = (this->m_depthCoord).m_data[3];
        fVar2 = (this->m_depthCoord).m_data[2];
        fVar3 = (this->m_depthCoord).m_data[0];
        fVar4 = (this->m_depthCoord).m_data[1];
        iVar13 = 0;
        do {
          fVar19 = ((float)(iVar14 + iVar13) + 0.5) / (float)local_310.m_width;
          if (1.0 <= fVar18 + fVar19) {
            fVar19 = (1.0 - fVar19) * (fVar4 - fVar1) + fVar1 + (fVar2 - fVar1) * (1.0 - fVar18);
          }
          else {
            fVar19 = fVar19 * (fVar2 - fVar3) + fVar3 + (fVar4 - fVar3) * fVar18;
          }
          if (this->m_compareFunc - 0x201 < 7) {
            fVar20 = 1.0 - (((float)iVar13 + 0.5) / (float)(local_310.m_width - iVar14) + fVar18) *
                           0.5;
            fVar19 = fVar19 * fVar17 + fVar16;
            uVar11 = 0xff00ff00;
            switch(this->m_compareFunc) {
            case 0x201:
              if (fVar20 <= fVar19) goto LAB_00f8451e;
              break;
            case 0x202:
              if ((fVar19 != fVar20) || (NAN(fVar19) || NAN(fVar20))) goto LAB_00f8451e;
              break;
            case 0x203:
              if (fVar20 < fVar19) goto LAB_00f8451e;
              break;
            case 0x204:
              if (fVar19 <= fVar20) goto LAB_00f8451e;
              break;
            case 0x205:
              if ((fVar19 == fVar20) && (!NAN(fVar19) && !NAN(fVar20))) goto LAB_00f8451e;
              break;
            case 0x206:
              if (fVar19 < fVar20) goto LAB_00f8451e;
            }
          }
          else {
LAB_00f8451e:
            uVar11 = 0xffff0000;
          }
          *(undefined4 *)
           ((long)local_310.m_pixels.m_ptr + (long)(iVar14 + iVar13 + local_310.m_width * iVar8) * 4
           ) = uVar11;
          iVar12 = iVar14 + iVar13;
          iVar13 = iVar13 + 1;
        } while (iVar12 + 1 < local_310.m_width);
      }
      iVar8 = iVar8 + 1;
    } while (iVar8 < local_310.m_height);
  }
  bVar6 = tcu::fuzzyCompare(local_2f8,"Result","Image comparison result",&local_310,&local_2d0,0.05,
                            COMPARE_LOG_RESULT);
  description = "Fail";
  if (bVar6) {
    description = "Pass";
  }
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,(uint)!bVar6,description
            );
  glu::ShaderProgram::~ShaderProgram(&local_100);
  tcu::Surface::~Surface(&local_310);
  tcu::Surface::~Surface(&local_2d0);
  return STOP;
}

Assistant:

DepthRangeCompareCase::IterateResult DepthRangeCompareCase::iterate (void)
{
	TestLog&					log					= m_testCtx.getLog();
	de::Random					rnd					(deStringHash(getName()));
	const tcu::RenderTarget&	renderTarget		= m_context.getRenderContext().getRenderTarget();
	const int					viewportW			= de::min(128, renderTarget.getWidth());
	const int					viewportH			= de::min(128, renderTarget.getHeight());
	const int					viewportX			= rnd.getInt(0, renderTarget.getWidth()-viewportW);
	const int					viewportY			= rnd.getInt(0, renderTarget.getHeight()-viewportH);
	tcu::Surface				renderedFrame		(viewportW, viewportH);
	tcu::Surface				referenceFrame		(viewportW, viewportH);
	const float					constDepth			= 0.1f;

	if (renderTarget.getDepthBits() == 0)
		throw tcu::NotSupportedError("Depth buffer is required", "", __FILE__, __LINE__);

	const glu::ShaderProgram	program				(m_context.getRenderContext(), glu::makeVtxFragSources(s_vertexShaderSrc, s_fragmentShaderSrc));

	if (!program.isOk())
	{
		log << program;
		TCU_FAIL("Compile failed");
	}

	const int					colorLoc			= glGetUniformLocation(program.getProgram(), "u_color");
	const int					posLoc				= glGetAttribLocation(program.getProgram(), "a_position");

	m_testCtx.getLog() << TestLog::Message << "glDepthRangef(" << m_zNear << ", " << m_zFar << ")" << TestLog::EndMessage;

	glViewport(viewportX, viewportY, viewportW, viewportH);
	glClear(GL_COLOR_BUFFER_BIT|GL_DEPTH_BUFFER_BIT|GL_STENCIL_BUFFER_BIT);
	glEnable(GL_DEPTH_TEST);
	glUseProgram(program.getProgram());
	glEnableVertexAttribArray(posLoc);

	static const deUint16 quadIndices[] = { 0, 1, 2, 2, 1, 3 };

	// Fill viewport with 2 quads - one with constant depth and another with d = [-1..1]
	{
		static const float constDepthCoord[] =
		{
			-1.0f, -1.0f, constDepth, 1.0f,
			-1.0f, +1.0f, constDepth, 1.0f,
			 0.0f, -1.0f, constDepth, 1.0f,
			 0.0f, +1.0f, constDepth, 1.0f
		};
		static const float varyingDepthCoord[] =
		{
			 0.0f, -1.0f, +1.0f, 1.0f,
			 0.0f, +1.0f,  0.0f, 1.0f,
			+1.0f, -1.0f,  0.0f, 1.0f,
			+1.0f, +1.0f, -1.0f, 1.0f
		};

		glUniform4f(colorLoc, 0.0f, 0.0f, 1.0f, 1.0f);
		glDepthFunc(GL_ALWAYS);

		glVertexAttribPointer(posLoc, 4, GL_FLOAT, GL_FALSE, 0, &constDepthCoord);
		glDrawElements(GL_TRIANGLES, DE_LENGTH_OF_ARRAY(quadIndices), GL_UNSIGNED_SHORT, &quadIndices[0]);

		glVertexAttribPointer(posLoc, 4, GL_FLOAT, GL_FALSE, 0, &varyingDepthCoord);
		glDrawElements(GL_TRIANGLES, DE_LENGTH_OF_ARRAY(quadIndices), GL_UNSIGNED_SHORT, &quadIndices[0]);

		GLU_CHECK();
	}

	// Render with depth test.
	{
		const float position[] =
		{
			-1.0f, -1.0f, m_depthCoord[0], 1.0f,
			-1.0f, +1.0f, m_depthCoord[1], 1.0f,
			+1.0f, -1.0f, m_depthCoord[2], 1.0f,
			+1.0f, +1.0f, m_depthCoord[3], 1.0f
		};

		glDepthRangef(m_zNear, m_zFar);
		glDepthFunc(m_compareFunc);
		glUniform4f(colorLoc, 0.0f, 1.0f, 0.0f, 1.0f);

		glVertexAttribPointer(posLoc, 4, GL_FLOAT, GL_FALSE, 0, &position[0]);
		glDrawElements(GL_TRIANGLES, DE_LENGTH_OF_ARRAY(quadIndices), GL_UNSIGNED_SHORT, &quadIndices[0]);

		GLU_CHECK();
	}

	glu::readPixels(m_context.getRenderContext(), viewportX, viewportY, renderedFrame.getAccess());

	// Render reference.
	for (int y = 0; y < referenceFrame.getHeight(); y++)
	{
		float	yf		= ((float)y + 0.5f) / (float)referenceFrame.getHeight();
		int		half	= de::clamp((int)((float)referenceFrame.getWidth()*0.5f + 0.5f), 0, referenceFrame.getWidth());

		// Fill left half - comparison to constant 0.5
		for (int x = 0; x < half; x++)
		{
			float	xf		= ((float)x + 0.5f) / (float)referenceFrame.getWidth();
			float	d		= depthRangeTransform(triQuadInterpolate(xf, yf, m_depthCoord), m_zNear, m_zFar);
			bool	dpass	= compare(m_compareFunc, d, constDepth*0.5f + 0.5f);

			referenceFrame.setPixel(x, y, dpass ? tcu::RGBA::green() : tcu::RGBA::blue());
		}

		// Fill right half - comparison to interpolated depth
		for (int x = half; x < referenceFrame.getWidth(); x++)
		{
			float	xf		= ((float)x + 0.5f) / (float)referenceFrame.getWidth();
			float	xh		= ((float)(x - half) + 0.5f) / (float)(referenceFrame.getWidth()-half);
			float	rd		= 1.0f - (xh + yf) * 0.5f;
			float	d		= depthRangeTransform(triQuadInterpolate(xf, yf, m_depthCoord), m_zNear, m_zFar);
			bool	dpass	= compare(m_compareFunc, d, rd);

			referenceFrame.setPixel(x, y, dpass ? tcu::RGBA::green() : tcu::RGBA::blue());
		}
	}

	bool isOk = tcu::fuzzyCompare(log, "Result", "Image comparison result", referenceFrame, renderedFrame, 0.05f, tcu::COMPARE_LOG_RESULT);
	m_testCtx.setTestResult(isOk ? QP_TEST_RESULT_PASS	: QP_TEST_RESULT_FAIL,
							isOk ? "Pass"				: "Fail");
	return STOP;
}